

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::format
          (BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,BasicCStringRef<char> format_str)

{
  char *end;
  char cVar1;
  Char *end_00;
  FormatError *this_00;
  Char *s;
  Arg arg;
  
  s = format_str.data_;
  while( true ) {
    while( true ) {
      do {
        end_00 = s;
        if (*s == '\0') {
          internal::FormatterBase::write<char>
                    (&this->super_FormatterBase,this->writer_,format_str.data_,s);
          return;
        }
        end = s + 1;
        cVar1 = *s;
        s = end;
      } while ((cVar1 != '}') && (cVar1 != '{'));
      if (*end != cVar1) break;
      internal::FormatterBase::write<char>
                (&this->super_FormatterBase,this->writer_,format_str.data_,end);
      s = s + 1;
      format_str.data_ = s;
    }
    if (cVar1 == '}') break;
    internal::FormatterBase::write<char>
              (&this->super_FormatterBase,this->writer_,format_str.data_,end_00);
    if ((*s == 0x5f) || ((byte)((*s & 0xdfU) + 0xbf) < 0x1a)) {
      parse_arg_name(&arg,this,&s);
    }
    else {
      parse_arg_index(&arg,this,&s);
    }
    s = format(this,&s,&arg);
    format_str.data_ = s;
  }
  this_00 = (FormatError *)__cxa_allocate_exception(0x10);
  FormatError::FormatError(this_00,(CStringRef)0x1310c0);
  __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

void BasicFormatter<Char, AF>::format(BasicCStringRef<Char> format_str) {
  const Char *s = format_str.c_str();
  const Char *start = s;
  while (*s) {
    Char c = *s++;
    if (c != '{' && c != '}') continue;
    if (*s == c) {
      write(writer_, start, s);
      start = ++s;
      continue;
    }
    if (c == '}')
      FMT_THROW(FormatError("unmatched '}' in format string"));
    write(writer_, start, s - 1);
    internal::Arg arg = internal::is_name_start(*s) ?
          parse_arg_name(s) : parse_arg_index(s);
    start = s = format(s, arg);
  }
  write(writer_, start, s);
}